

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.c
# Opt level: O2

void Mig_ManStop(Mig_Man_t *p)

{
  int *piVar1;
  void **__ptr;
  void *pvVar2;
  int i;
  
  piVar1 = (p->vTravIds).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vTravIds).pArray = (int *)0x0;
  }
  piVar1 = (p->vCopies).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCopies).pArray = (int *)0x0;
  }
  piVar1 = (p->vLevels).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vLevels).pArray = (int *)0x0;
  }
  piVar1 = (p->vRefs).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vRefs).pArray = (int *)0x0;
  }
  piVar1 = (p->vSibls).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vSibls).pArray = (int *)0x0;
  }
  i = 0;
  while (p->iPage = i, i < (p->vPages).nSize) {
    pvVar2 = Vec_PtrEntry(&p->vPages,i);
    p->pPage = (Mig_Obj_t *)((long)pvVar2 + -0x10);
    free((Mig_Obj_t *)((long)pvVar2 + -0x10));
    p->pPage = (Mig_Obj_t *)0x0;
    i = p->iPage + 1;
  }
  __ptr = (p->vPages).pArray;
  if (__ptr != (void **)0x0) {
    free(__ptr);
    (p->vPages).pArray = (void **)0x0;
  }
  piVar1 = (p->vCis).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCis).pArray = (int *)0x0;
  }
  piVar1 = (p->vCos).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCos).pArray = (int *)0x0;
  }
  free(p->pName);
  free(p);
  return;
}

Assistant:

void Mig_ManStop( Mig_Man_t * p )
{
    if ( 0 )
    printf( "Subject graph uses %d pages of %d objects with %d entries. Total memory = %.2f MB.\n", 
        Vec_PtrSize(&p->vPages), MIG_MASK + 1, p->nObjs,
        1.0 * Vec_PtrSize(&p->vPages) * (MIG_MASK + 1) * 16 / (1 << 20) );
    // attributes
    ABC_FREE( p->vTravIds.pArray );
    ABC_FREE( p->vCopies.pArray );
    ABC_FREE( p->vLevels.pArray );
    ABC_FREE( p->vRefs.pArray );
    ABC_FREE( p->vSibls.pArray );
    // pages
    Vec_PtrForEachEntry( Mig_Obj_t *, &p->vPages, p->pPage, p->iPage )
        --p->pPage, ABC_FREE( p->pPage );
    // objects
    ABC_FREE( p->vPages.pArray );
    ABC_FREE( p->vCis.pArray );
    ABC_FREE( p->vCos.pArray );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}